

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_sao.c
# Opt level: O2

void ihevc_sao_edge_offset_class3_chroma
               (UWORD8 *pu1_src,WORD32 src_strd,UWORD8 *pu1_src_left,UWORD8 *pu1_src_top,
               UWORD8 *pu1_src_top_left,UWORD8 *pu1_src_top_right,UWORD8 *pu1_src_bot_left,
               UWORD8 *pu1_avail,WORD8 *pi1_sao_offset_u,WORD8 *pi1_sao_offset_v,WORD32 wd,WORD32 ht
               )

{
  long lVar1;
  UWORD8 UVar2;
  UWORD8 UVar3;
  UWORD8 UVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  int iVar10;
  uint uVar11;
  long lVar12;
  UWORD8 *pUVar13;
  ulong uVar14;
  byte bVar15;
  uint uVar16;
  ulong uVar17;
  byte bVar18;
  WORD8 *pWVar19;
  byte bVar20;
  int iVar21;
  byte bVar22;
  WORD8 au1_sign_up [64];
  UWORD8 au1_src_top_tmp [64];
  UWORD8 au1_src_left_tmp [128];
  byte local_200;
  byte local_1fc;
  UWORD8 *local_1a8;
  byte local_178 [128];
  UWORD8 aUStack_f8 [64];
  UWORD8 aUStack_b8 [136];
  
  lVar12 = (long)wd;
  local_178[0] = 0xff;
  local_178[1] = 0xff;
  local_178[2] = 0xff;
  local_178[3] = 0xff;
  local_178[4] = 0xff;
  local_178[5] = 0xff;
  local_178[6] = 0xff;
  local_178[7] = 0xff;
  local_178[8] = 0xff;
  local_178[9] = 0xff;
  local_178[10] = 0xff;
  local_178[0xb] = 0xff;
  local_178[0xc] = 0xff;
  local_178[0xd] = 0xff;
  local_178[0xe] = 0xff;
  local_178[0xf] = 0xff;
  local_178[0x10] = 0xff;
  local_178[0x11] = 0xff;
  local_178[0x12] = 0xff;
  local_178[0x13] = 0xff;
  local_178[0x14] = 0xff;
  local_178[0x15] = 0xff;
  local_178[0x16] = 0xff;
  local_178[0x17] = 0xff;
  local_178[0x18] = 0xff;
  local_178[0x19] = 0xff;
  local_178[0x1a] = 0xff;
  local_178[0x1b] = 0xff;
  local_178[0x1c] = 0xff;
  local_178[0x1d] = 0xff;
  local_178[0x1e] = 0xff;
  local_178[0x1f] = 0xff;
  local_178[0x20] = 0xff;
  local_178[0x21] = 0xff;
  local_178[0x22] = 0xff;
  local_178[0x23] = 0xff;
  local_178[0x24] = 0xff;
  local_178[0x25] = 0xff;
  local_178[0x26] = 0xff;
  local_178[0x27] = 0xff;
  local_178[0x28] = 0xff;
  local_178[0x29] = 0xff;
  local_178[0x2a] = 0xff;
  local_178[0x2b] = 0xff;
  local_178[0x2c] = 0xff;
  local_178[0x2d] = 0xff;
  local_178[0x2e] = 0xff;
  local_178[0x2f] = 0xff;
  local_178[0x30] = 0xff;
  local_178[0x31] = 0xff;
  local_178[0x32] = 0xff;
  local_178[0x33] = 0xff;
  local_178[0x34] = 0xff;
  local_178[0x35] = 0xff;
  local_178[0x36] = 0xff;
  local_178[0x37] = 0xff;
  local_178[0x38] = 0xff;
  local_178[0x39] = 0xff;
  local_178[0x3a] = 0xff;
  local_178[0x3b] = 0xff;
  local_178[0x3c] = 0xff;
  local_178[0x3d] = 0xff;
  local_178[0x3e] = 0xff;
  local_178[0x3f] = 0xff;
  uVar5 = wd - 2;
  UVar2 = pu1_src_top[(int)uVar5];
  UVar3 = pu1_src_top[lVar12 + -1];
  uVar7 = 0;
  uVar17 = 0;
  if (0 < ht) {
    uVar17 = (ulong)(uint)ht;
  }
  lVar1 = lVar12 + -1;
  pUVar13 = pu1_src + lVar12 + -1;
  for (; uVar17 != uVar7; uVar7 = uVar7 + 1) {
    aUStack_b8[uVar7 * 2] = pUVar13[-1];
    aUStack_b8[uVar7 * 2 + 1] = *pUVar13;
    pUVar13 = pUVar13 + src_strd;
  }
  iVar6 = (ht + -1) * src_strd;
  uVar7 = 0;
  uVar17 = 0;
  if (0 < wd) {
    uVar17 = (ulong)(uint)wd;
  }
  for (; uVar17 != uVar7; uVar7 = uVar7 + 1) {
    aUStack_f8[uVar7] = pu1_src[uVar7 + (long)iVar6];
  }
  bVar18 = pu1_src[(int)uVar5];
  if (pu1_avail[5] == '\0') {
    local_200 = pu1_src[lVar1];
  }
  else {
    uVar16 = bVar18 == *pu1_src_top_right ^ 3;
    if (bVar18 < *pu1_src_top_right) {
      uVar16 = 1;
    }
    uVar11 = 0xffffffff;
    if (pu1_src[src_strd + wd + -4] <= bVar18) {
      uVar11 = (uint)(bVar18 != pu1_src[src_strd + wd + -4]);
    }
    uVar8 = (uint)bVar18;
    if (uVar11 + uVar16 != 2) {
      uVar16 = (int)pi1_sao_offset_u[gi4_ihevc_table_edge_idx[uVar11 + uVar16]] + (uint)bVar18;
      uVar8 = 0xff;
      if (((int)uVar16 < 0x100) && (uVar8 = 0, 0 < (int)uVar16)) {
        uVar8 = uVar16;
      }
    }
    bVar18 = (byte)uVar8;
    local_200 = pu1_src[lVar1];
    uVar16 = local_200 == pu1_src_top_right[1] ^ 3;
    if (local_200 < pu1_src_top_right[1]) {
      uVar16 = 1;
    }
    uVar11 = 0xffffffff;
    if (pu1_src[wd + src_strd + -3] <= local_200) {
      uVar11 = (uint)(local_200 != pu1_src[wd + src_strd + -3]);
    }
    if (uVar11 + uVar16 != 2) {
      iVar21 = (int)pi1_sao_offset_v[gi4_ihevc_table_edge_idx[uVar11 + uVar16]] + (uint)local_200;
      if (iVar21 < 0x100) {
        iVar10 = 0;
        if (0 < iVar21) {
          iVar10 = iVar21;
        }
        local_200 = (byte)iVar10;
      }
      else {
        local_200 = 0xff;
      }
    }
  }
  bVar15 = pu1_src[iVar6];
  uVar16 = (uint)bVar15;
  if (pu1_avail[6] == '\0') {
    local_1fc = pu1_src[(long)iVar6 + 1];
  }
  else {
    uVar11 = bVar15 == pu1_src[(iVar6 - src_strd) + 2] ^ 3;
    if (bVar15 < pu1_src[(iVar6 - src_strd) + 2]) {
      uVar11 = 1;
    }
    uVar8 = 0xffffffff;
    if (*pu1_src_bot_left <= bVar15) {
      uVar8 = (uint)(bVar15 != *pu1_src_bot_left);
    }
    if (uVar8 + uVar11 != 2) {
      uVar11 = (int)pi1_sao_offset_u[gi4_ihevc_table_edge_idx[uVar8 + uVar11]] + (uint)bVar15;
      uVar16 = 0x1776ff;
      if (((int)uVar11 < 0x100) && (uVar16 = 0, 0 < (int)uVar11)) {
        uVar16 = uVar11;
      }
    }
    bVar15 = (byte)uVar16;
    local_1fc = pu1_src[(long)iVar6 + 1];
    uVar16 = local_1fc == pu1_src[(iVar6 - src_strd) + 3] ^ 3;
    if (local_1fc < pu1_src[(iVar6 - src_strd) + 3]) {
      uVar16 = 1;
    }
    uVar11 = 0xffffffff;
    if (pu1_src_bot_left[1] <= local_1fc) {
      uVar11 = (uint)(local_1fc != pu1_src_bot_left[1]);
    }
    if (uVar11 + uVar16 != 2) {
      iVar6 = (int)pi1_sao_offset_v[gi4_ihevc_table_edge_idx[uVar11 + uVar16]] + (uint)local_1fc;
      local_1fc = 0xff;
      if (iVar6 < 0x100) {
        iVar21 = 0;
        if (0 < iVar6) {
          iVar21 = iVar6;
        }
        local_1fc = (byte)iVar21;
      }
    }
  }
  if (*pu1_avail == '\0') {
    local_178[0] = 0;
    local_178[1] = 0xff;
    local_178[2] = 0xff;
    local_178[3] = 0xff;
  }
  uVar7 = 0;
  if (0 < (int)uVar5) {
    uVar7 = (ulong)uVar5;
  }
  if (pu1_avail[2] == '\0') {
    pu1_src = pu1_src + src_strd;
    for (uVar9 = 0; uVar7 != uVar9; uVar9 = uVar9 + 1) {
      bVar22 = pu1_src[uVar9] != pu1_src[(2 - src_strd) + (int)uVar9];
      if (pu1_src[uVar9] < pu1_src[(2 - src_strd) + (int)uVar9]) {
        bVar22 = 0xff;
      }
      local_178[uVar9 + 0x40] = bVar22;
    }
    local_1a8 = pu1_src_left + 2;
    ht = ht + -1;
  }
  else {
    for (uVar9 = 0; local_1a8 = pu1_src_left, uVar7 != uVar9; uVar9 = uVar9 + 1) {
      bVar22 = pu1_src[uVar9] != pu1_src_top[uVar9 + 2];
      if (pu1_src[uVar9] < pu1_src_top[uVar9 + 2]) {
        bVar22 = 0xff;
      }
      local_178[uVar9 + 0x40] = bVar22;
    }
  }
  if (pu1_avail[1] == '\0') {
    local_178[(int)lVar1 >> 1] = 0;
  }
  iVar6 = 2;
  uVar16 = ht - (uint)(pu1_avail[3] == '\0');
  uVar9 = 0;
  uVar7 = 0;
  if (0 < (int)uVar16) {
    uVar7 = (ulong)uVar16;
  }
  for (; uVar9 != uVar7; uVar9 = uVar9 + 1) {
    bVar22 = pu1_src[(int)uVar5] != pu1_src[wd - src_strd];
    if (pu1_src[(int)uVar5] < pu1_src[wd - src_strd]) {
      bVar22 = 0xff;
    }
    local_178[(long)(int)uVar5 + 0x40] = bVar22;
    bVar22 = pu1_src[lVar1] != pu1_src[(wd - src_strd) + 1];
    if (pu1_src[lVar1] < pu1_src[(wd - src_strd) + 1]) {
      bVar22 = 0xff;
    }
    local_178[lVar12 + 0x3f] = bVar22;
    for (uVar14 = 0; uVar17 != uVar14; uVar14 = uVar14 + 1) {
      pWVar19 = pi1_sao_offset_u;
      if ((uVar14 & 1) != 0) {
        pWVar19 = pi1_sao_offset_v;
      }
      bVar22 = pu1_src[uVar14];
      if (uVar14 < 2) {
        bVar20 = local_1a8[uVar14 + (long)iVar6];
      }
      else {
        bVar20 = pu1_src[src_strd + -2 + (int)uVar14];
      }
      uVar11 = 0xffffffff;
      if (bVar20 <= bVar22) {
        uVar11 = (uint)(bVar20 < bVar22);
      }
      if (1 < uVar14) {
        local_178[uVar14 + 0x3e] = -(char)uVar11;
      }
      if (((uint)local_178[uVar14 >> 1 & 0x7fffffff] &
          gi4_ihevc_table_edge_idx[(long)(char)local_178[uVar14 + 0x40] + (long)(int)uVar11 + 2]) !=
          0) {
        iVar21 = (int)pWVar19[(uint)local_178[uVar14 >> 1 & 0x7fffffff] &
                              gi4_ihevc_table_edge_idx
                              [(long)(char)local_178[uVar14 + 0x40] + (long)(int)uVar11 + 2]] +
                 (uint)bVar22;
        if (iVar21 < 1) {
          iVar21 = 0;
        }
        if (0xfe < iVar21) {
          iVar21 = 0xff;
        }
        pu1_src[uVar14] = (UWORD8)iVar21;
      }
    }
    pu1_src = pu1_src + src_strd;
    iVar6 = iVar6 + 2;
  }
  uVar8 = uVar16 + 1;
  uVar11 = uVar16;
  if (pu1_avail[2] == '\0') {
    uVar11 = uVar8;
  }
  pu1_src[(int)(uVar5 - uVar11 * src_strd)] = bVar18;
  uVar5 = uVar16;
  if (pu1_avail[2] == '\0') {
    uVar5 = uVar8;
  }
  pu1_src[(int)(~(uVar5 * src_strd) + wd)] = local_200;
  uVar9 = 0;
  uVar7 = (long)-src_strd;
  if (pu1_avail[3] == '\0') {
    uVar7 = uVar9;
  }
  pu1_src[uVar7] = bVar15;
  lVar12 = 1;
  if (pu1_avail[3] != '\0') {
    lVar12 = (long)(1 - src_strd);
  }
  pu1_src[lVar12] = local_1fc;
  if (pu1_avail[2] == '\0') {
    uVar16 = uVar8;
  }
  UVar4 = pu1_avail[3];
  *pu1_src_top_left = UVar2;
  pu1_src_top_left[1] = UVar3;
  uVar5 = (uVar16 + (UVar4 == '\0')) * 2;
  uVar7 = (ulong)uVar5;
  if ((int)uVar5 < 1) {
    uVar7 = uVar9;
  }
  for (; uVar7 != uVar9; uVar9 = uVar9 + 1) {
    pu1_src_left[uVar9] = aUStack_b8[uVar9];
  }
  for (uVar7 = 0; uVar17 != uVar7; uVar7 = uVar7 + 1) {
    pu1_src_top[uVar7] = aUStack_f8[uVar7];
  }
  return;
}

Assistant:

void ihevc_sao_edge_offset_class3_chroma(UWORD8 *pu1_src,
                                         WORD32 src_strd,
                                         UWORD8 *pu1_src_left,
                                         UWORD8 *pu1_src_top,
                                         UWORD8 *pu1_src_top_left,
                                         UWORD8 *pu1_src_top_right,
                                         UWORD8 *pu1_src_bot_left,
                                         UWORD8 *pu1_avail,
                                         WORD8 *pi1_sao_offset_u,
                                         WORD8 *pi1_sao_offset_v,
                                         WORD32 wd,
                                         WORD32 ht)
{
    WORD32 row, col;
    UWORD8 au1_mask[MAX_CTB_SIZE];
    UWORD8 au1_src_left_tmp[2 * MAX_CTB_SIZE], au1_src_top_tmp[MAX_CTB_SIZE];
    UWORD8 au1_src_top_left_tmp[2];
    WORD8 au1_sign_up[MAX_CTB_SIZE];
    UWORD8 *pu1_src_left_cpy;
    WORD8 u1_sign_down;
    WORD32 bit_depth;

    UWORD8 u1_pos_wd_0_tmp_u;
    UWORD8 u1_pos_wd_0_tmp_v;
    UWORD8 u1_pos_0_ht_tmp_u;
    UWORD8 u1_pos_0_ht_tmp_v;

    bit_depth = BIT_DEPTH_CHROMA;
    pu1_src_left_cpy = pu1_src_left;

    /* Initialize the mask values */
    memset(au1_mask, 0xFF, MAX_CTB_SIZE);

    /* Update left, top and top-left arrays */
    au1_src_top_left_tmp[0] = pu1_src_top[wd - 2];
    au1_src_top_left_tmp[1] = pu1_src_top[wd - 1];
    for(row = 0; row < ht; row++)
    {
        au1_src_left_tmp[2 * row] = pu1_src[row * src_strd + wd - 2];
        au1_src_left_tmp[2 * row + 1] = pu1_src[row * src_strd + wd - 1];
    }
    for(col = 0; col < wd; col++)
    {
        au1_src_top_tmp[col] = pu1_src[(ht - 1) * src_strd + col];
    }


    /* If top-right is available, process separately */
    if(0 != pu1_avail[5])
    {
        WORD32 edge_idx;

        /* U */
        edge_idx = 2 + SIGN(pu1_src[wd - 2] - pu1_src_top_right[0]) +
                        SIGN(pu1_src[wd - 2] - pu1_src[wd - 2 - 2 + src_strd]);

        edge_idx = gi4_ihevc_table_edge_idx[edge_idx];

        if(0 != edge_idx)
        {
            u1_pos_wd_0_tmp_u = CLIP3(pu1_src[wd - 2] + pi1_sao_offset_u[edge_idx], 0, (1 << bit_depth) - 1);
        }
        else
        {
            u1_pos_wd_0_tmp_u = pu1_src[wd - 2];
        }

        /* V */
        edge_idx = 2 + SIGN(pu1_src[wd - 1] - pu1_src_top_right[1]) +
                        SIGN(pu1_src[wd - 1] - pu1_src[wd - 1 - 2 + src_strd]);

        edge_idx = gi4_ihevc_table_edge_idx[edge_idx];

        if(0 != edge_idx)
        {
            u1_pos_wd_0_tmp_v = CLIP3(pu1_src[wd - 1] + pi1_sao_offset_v[edge_idx], 0, (1 << bit_depth) - 1);
        }
        else
        {
            u1_pos_wd_0_tmp_v = pu1_src[wd - 1];
        }
    }
    else
    {
        u1_pos_wd_0_tmp_u = pu1_src[wd - 2];
        u1_pos_wd_0_tmp_v = pu1_src[wd - 1];
    }

    /* If bottom-left is available, process separately */
    if(0 != pu1_avail[6])
    {
        WORD32 edge_idx;

        /* U */
        edge_idx = 2 + SIGN(pu1_src[(ht - 1) * src_strd] - pu1_src[(ht - 1) * src_strd + 2 - src_strd]) +
                        SIGN(pu1_src[(ht - 1) * src_strd] - pu1_src_bot_left[0]);

        edge_idx = gi4_ihevc_table_edge_idx[edge_idx];

        if(0 != edge_idx)
        {
            u1_pos_0_ht_tmp_u = CLIP3(pu1_src[(ht - 1) * src_strd] + pi1_sao_offset_u[edge_idx], 0, (1 << bit_depth) - 1);
        }
        else
        {
            u1_pos_0_ht_tmp_u = pu1_src[(ht - 1) * src_strd];
        }

        /* V */
        edge_idx = 2 + SIGN(pu1_src[(ht - 1) * src_strd + 1] - pu1_src[(ht - 1) * src_strd + 1 + 2 - src_strd]) +
                        SIGN(pu1_src[(ht - 1) * src_strd + 1] - pu1_src_bot_left[1]);

        edge_idx = gi4_ihevc_table_edge_idx[edge_idx];

        if(0 != edge_idx)
        {
            u1_pos_0_ht_tmp_v = CLIP3(pu1_src[(ht - 1) * src_strd + 1] + pi1_sao_offset_v[edge_idx], 0, (1 << bit_depth) - 1);
        }
        else
        {
            u1_pos_0_ht_tmp_v = pu1_src[(ht - 1) * src_strd + 1];
        }
    }
    else
    {
        u1_pos_0_ht_tmp_u = pu1_src[(ht - 1) * src_strd];
        u1_pos_0_ht_tmp_v = pu1_src[(ht - 1) * src_strd + 1];
    }

    /* If Left is not available */
    if(0 == pu1_avail[0])
    {
        au1_mask[0] = 0;
    }

    /* If Top is not available */
    if(0 == pu1_avail[2])
    {
        pu1_src += src_strd;
        ht--;
        pu1_src_left_cpy += 2;
        for(col = 0; col < wd - 2; col++)
        {
            au1_sign_up[col] = SIGN(pu1_src[col] - pu1_src[col + 2 - src_strd]);
        }
    }
    else
    {
        for(col = 0; col < wd - 2; col++)
        {
            au1_sign_up[col] = SIGN(pu1_src[col] - pu1_src_top[col + 2]);
        }
    }

    /* If Right is not available */
    if(0 == pu1_avail[1])
    {
        au1_mask[(wd - 1) >> 1] = 0;
    }

    /* If Bottom is not available */
    if(0 == pu1_avail[3])
    {
        ht--;
    }

    /* Processing is done on the intermediate buffer and the output is written to the source buffer */
    {
        for(row = 0; row < ht; row++)
        {
            au1_sign_up[wd - 2] = SIGN(pu1_src[wd - 2] - pu1_src[wd - 2 + 2 - src_strd]);
            au1_sign_up[wd - 1] = SIGN(pu1_src[wd - 1] - pu1_src[wd - 1 + 2 - src_strd]);
            for(col = 0; col < wd; col++)
            {
                WORD32 edge_idx;
                WORD8 *pi1_sao_offset;

                pi1_sao_offset = (0 == col % 2) ? pi1_sao_offset_u : pi1_sao_offset_v;

                u1_sign_down = SIGN(pu1_src[col] - ((col < 2) ? pu1_src_left_cpy[2 * (row + 1) + col] :
                                                                pu1_src[col - 2 + src_strd]));
                edge_idx = 2 + au1_sign_up[col] + u1_sign_down;
                if(col > 1)
                    au1_sign_up[col - 2] = -u1_sign_down;

                edge_idx = gi4_ihevc_table_edge_idx[edge_idx] & au1_mask[col >> 1];

                if(0 != edge_idx)
                {
                    pu1_src[col] = CLIP3(pu1_src[col] + pi1_sao_offset[edge_idx], 0, (1 << bit_depth) - 1);
                }
            }

            pu1_src += src_strd;
        }

        pu1_src[-(pu1_avail[2] ? ht : ht + 1) * src_strd + wd - 2] = u1_pos_wd_0_tmp_u;
        pu1_src[-(pu1_avail[2] ? ht : ht + 1) * src_strd + wd - 1] = u1_pos_wd_0_tmp_v;
        pu1_src[(pu1_avail[3] ?  (-src_strd) : 0)] = u1_pos_0_ht_tmp_u;
        pu1_src[(pu1_avail[3] ?  (-src_strd) : 0) + 1] = u1_pos_0_ht_tmp_v;
    }

    if(0 == pu1_avail[2])
        ht++;
    if(0 == pu1_avail[3])
        ht++;
    pu1_src_top_left[0] = au1_src_top_left_tmp[0];
    pu1_src_top_left[1] = au1_src_top_left_tmp[1];
    for(row = 0; row < 2 * ht; row++)
    {
        pu1_src_left[row] = au1_src_left_tmp[row];
    }
    for(col = 0; col < wd; col++)
    {
        pu1_src_top[col] = au1_src_top_tmp[col];
    }

}